

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_refs_mark_task_CALL(WorkerP *w,Task *__dq_head)

{
  long *in_FS_OFFSET;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  lddmc_refs_mark_p_par_SPAWN
            (w,__dq_head,(MDD **)**(undefined8 **)(*in_FS_OFFSET + -0x20),
             *(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x10) - **(long **)(*in_FS_OFFSET + -0x20)
             >> 3);
  lddmc_refs_mark_r_par_SPAWN
            (w,__dq_head + 1,*(MDD **)(*(long *)(*in_FS_OFFSET + -0x20) + 0x18),
             *(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x28) -
             *(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x18) >> 3);
  lddmc_refs_mark_s_par_CALL
            (w,__dq_head + 2,*(lddmc_refs_task_t *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x30),
             *(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x40) -
             *(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x30) >> 4);
  lddmc_refs_mark_r_par_SYNC(w,__dq_head + 1);
  lddmc_refs_mark_p_par_SYNC(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_0(lddmc_refs_mark_task)
{
    LOCALIZE_THREAD_LOCAL(lddmc_refs_key, lddmc_refs_internal_t);
    SPAWN(lddmc_refs_mark_p_par, lddmc_refs_key->pbegin, lddmc_refs_key->pcur-lddmc_refs_key->pbegin);
    SPAWN(lddmc_refs_mark_r_par, lddmc_refs_key->rbegin, lddmc_refs_key->rcur-lddmc_refs_key->rbegin);
    CALL(lddmc_refs_mark_s_par, lddmc_refs_key->sbegin, lddmc_refs_key->scur-lddmc_refs_key->sbegin);
    SYNC(lddmc_refs_mark_r_par);
    SYNC(lddmc_refs_mark_p_par);
}